

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  vm *v_00;
  wasm_reader *wr_00;
  module *m_00;
  module *m;
  wasm_reader *wr;
  vm *v;
  char *filename;
  
  init_opNames();
  init_op();
  _Var1 = stack_test();
  if (!_Var1) {
    fprintf(_stderr,"stack op wrong\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/main.c"
                  ,0x11,"int main()");
  }
  v_00 = createVM();
  wr_00 = createWasmReader();
  m_00 = createModule("/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/js/ch01_hw.wasm");
  decode_module(wr_00,m_00);
  wcasm_objdump(m_00);
  exec(v_00,m_00);
  free_module(wr_00,m_00);
  destroy_wasm_reader(wr_00);
  destroyVM(v_00);
  return 0;
}

Assistant:

int main() {
    INIT_MAIN();
    if (!stack_test()) {
        errorExit("stack op wrong\n");
    }
    const char *filename = "/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/rust/examples/target/wasm32-unknown-unknown/release/ch01_hw.wasm";
    filename = "/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/js/ch01_hw.wasm";
//    filename = "/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/wat/ch09_calc.wasm";

    vm *v = createVM();
    wasm_reader *wr = createWasmReader();
    module *m = createModule(filename);

    decode_module(wr, m);
#ifdef DUMP_SEGMENT
    wcasm_objdump(m);
#endif
    exec(v, m);

    free_module(wr, m);
    destroy_wasm_reader(wr);
    destroyVM(v);
    return 0;
}